

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

bool __thiscall
ddd::DaTrie<false,_false,_false>::delete_key(DaTrie<false,_false,_false> *this,Query *query)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  DaTrie<false,_false,_false> local_98;
  
  bVar2 = search_key(this,query);
  if (bVar2) {
    if (query->node_pos_ == 0) {
      local_98.node_links_.super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.node_links_.super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_98.blocks_.super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_98.node_links_.super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.blocks_.super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.blocks_.super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.tail_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      local_98.tail_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      local_98.bc_.super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_98.tail_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      local_98.bc_.super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.bc_.super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.head_pos_ = 0xffffffff;
      local_98.bc_emps_ = 0;
      local_98.tail_emps_ = 0;
      swap(&local_98,this);
      ~DaTrie(&local_98);
    }
    else {
      bVar3 = is_terminal_(this,query->node_pos_);
      if (!bVar3) {
        uVar4 = utils::length((this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start +
                              (SUB84((this->bc_).
                                     super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                                     super__Vector_impl_data._M_start[query->node_pos_],0) &
                              0x7fffffff));
        this->tail_emps_ = uVar4 + this->tail_emps_ + 4;
      }
      uVar1 = *(uint *)&(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                        super__Vector_impl_data._M_start[query->node_pos_].field_0x4;
      unfix_(this,query->node_pos_,&this->blocks_);
      query->node_pos_ = uVar1 & 0x7fffffff;
      query->is_finished_ = false;
      query->pos_ = query->pos_ - 1;
      change_branch_(this,query);
    }
  }
  return bVar2;
}

Assistant:

bool delete_key(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());
    assert(!Prefix);

    if (!search_key(query)) {
      return false;
    }

    if (query.node_pos() == ROOT_POS) {
      DaTrie().swap(*this);
      return true;
    }

    if (WithNLM) {
      delete_sib_(query.node_pos());
    }

    if (!is_terminal_(query.node_pos())) {
      auto tail_pos = bc_[query.node_pos()].value();
      tail_emps_ += utils::length(tail_.data() + tail_pos) + sizeof(uint32_t);
    }

    auto parent_pos = bc_[query.node_pos()].check();
    unfix_(query.node_pos(), blocks_);
    query.prev(parent_pos);

    change_branch_(query);
    return true;
  }